

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O0

void Bmc_CexCareVerify(Aig_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexMin,int fVerbose)

{
  int iVar1;
  Gia_Man_t *p_00;
  Gia_Man_t *pGia;
  int fVerbose_local;
  Abc_Cex_t *pCexMin_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *p_local;
  
  p_00 = Gia_ManFromAigSimple(p);
  if (fVerbose != 0) {
    printf("Original :    ");
    iVar1 = Gia_ManPiNum(p_00);
    Bmc_CexPrint(pCex,iVar1,0);
    printf("Minimized:    ");
    iVar1 = Gia_ManPiNum(p_00);
    Bmc_CexPrint(pCexMin,iVar1,0);
  }
  iVar1 = Bmc_CexVerify(p_00,pCex,pCexMin);
  if (iVar1 == 0) {
    printf("Counter-example verification has failed.\n");
  }
  else {
    printf("Counter-example verification succeeded.\n");
  }
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Bmc_CexCareVerify( Aig_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexMin, int fVerbose )
{
    Gia_Man_t * pGia = Gia_ManFromAigSimple( p );
    if ( fVerbose )
    {
        printf( "Original :    " );
        Bmc_CexPrint( pCex, Gia_ManPiNum(pGia), 0 );
        printf( "Minimized:    " );
        Bmc_CexPrint( pCexMin, Gia_ManPiNum(pGia), 0 );
    }
    if ( !Bmc_CexVerify( pGia, pCex, pCexMin ) )
        printf( "Counter-example verification has failed.\n" );
    else 
        printf( "Counter-example verification succeeded.\n" );
    Gia_ManStop( pGia );
}